

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::DoSimdShuffle(Thread *this,Instr instr)

{
  byte bVar1;
  u8 i;
  long lVar2;
  uchar *puVar3;
  Simd<unsigned_char,_(unsigned_char)__x10_> SVar4;
  Simd<unsigned_char,_(unsigned_char)__x10_> rhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> local_48;
  uchar local_38 [16];
  uchar local_28 [16];
  u64 local_18;
  undefined8 uStack_10;
  
  local_18 = instr.field_2.imm_u64;
  uStack_10 = instr.field_2._8_8_;
  local_28 = (uchar  [16])Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  SVar4 = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  local_38[0] = SVar4.v[0];
  local_38[1] = SVar4.v[1];
  local_38[2] = SVar4.v[2];
  local_38[3] = SVar4.v[3];
  local_38[4] = SVar4.v[4];
  local_38[5] = SVar4.v[5];
  local_38[6] = SVar4.v[6];
  local_38[7] = SVar4.v[7];
  local_38[8] = SVar4.v[8];
  local_38[9] = SVar4.v[9];
  local_38[10] = SVar4.v[10];
  local_38[0xb] = SVar4.v[0xb];
  local_38[0xc] = SVar4.v[0xc];
  local_38[0xd] = SVar4.v[0xd];
  local_38[0xe] = SVar4.v[0xe];
  local_38[0xf] = SVar4.v[0xf];
  lVar2 = 0;
  do {
    bVar1 = *(byte *)((long)&local_18 + lVar2);
    puVar3 = local_28 + (byte)(bVar1 - 0x10);
    if (bVar1 < 0x10) {
      puVar3 = local_38 + bVar1;
    }
    local_48.v[lVar2] = *puVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,local_48);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShuffle(Instr instr) {
  using S = u8x16;
  auto sel = Bitcast<S>(instr.imm_v128);
  auto rhs = Pop<S>();
  auto lhs = Pop<S>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] =
        sel[i] < S::lanes ? lhs[sel[i]] : rhs[sel[i] - S::lanes];
  }
  Push(result);
  return RunResult::Ok;
}